

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
amrex::get_slice_data
          (int dir,Real coord,MultiFab *cc,Geometry *geom,int start_comp,int ncomp,bool interpolate)

{
  Array4<double> slice_00;
  bool bVar1;
  undefined4 uVar2;
  iterator *rhs;
  char *pcVar3;
  int *piVar4;
  FArrayBox *pFVar5;
  int __c;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> in_RDI;
  undefined4 in_R9D;
  byte in_stack_00000008;
  Box thread_box;
  iterator __end4;
  iterator __begin4;
  range_impl<amrex::Box> *__range4;
  Box *tile_box;
  Array4<const_double> *full_arr;
  Array4<double> *slice_arr;
  FArrayBox *full_fab;
  FArrayBox *slice_fab;
  int full_gid;
  int slice_gid;
  MFIter mfi;
  Vector<int,_std::allocator<int>_> slice_to_full_ba_map;
  GeometryData geomdata;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *slice;
  MFIter *in_stack_fffffffffffffac8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffad0;
  Geometry *in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffaf0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffaf8;
  MFIter *in_stack_fffffffffffffb00;
  _Head_base<0UL,_amrex::MultiFab_*,_false> this;
  MFIter *local_4c0;
  FabArray<amrex::FArrayBox> *pFStack_4b8;
  Real in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  Array4<const_double> *in_stack_fffffffffffffb78;
  Box *in_stack_fffffffffffffb80;
  iterator local_460;
  iterator local_448;
  undefined1 local_430 [40];
  undefined1 *local_408;
  undefined1 local_3fc [28];
  undefined1 *local_3e0;
  Box local_3d8 [2];
  int in_stack_fffffffffffffc64;
  Box *destbox;
  int in_stack_fffffffffffffc74;
  Box *in_stack_fffffffffffffc78;
  BaseFab<double> *in_stack_fffffffffffffc80;
  BaseFab<double> *in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffca0 [16];
  Array4<double> *this_00;
  iterator *piVar6;
  int iVar7;
  undefined1 in_stack_fffffffffffffcd0 [16];
  GeometryData *in_stack_fffffffffffffce0;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd20;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd28;
  Geometry *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd3c;
  uint7 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  Dim3 local_1cc;
  Box *local_1c0;
  int local_1b8;
  Box *local_1b0;
  int local_1a8;
  int local_1a4;
  iterator *local_1a0;
  double *local_198;
  Box *local_190;
  int local_188;
  iterator *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  iterator *local_168;
  undefined4 local_15c;
  iterator *local_158;
  undefined4 local_14c;
  iterator *local_148;
  Dim3 local_140;
  iterator *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  undefined1 *local_118;
  undefined4 local_10c;
  undefined1 *local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  int numcomp;
  undefined8 uVar8;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffffaf0 >> 0x38);
  this._M_head_impl =
       (MultiFab *)
       in_RDI.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
       super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  Geometry::data(in_stack_fffffffffffffae0);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x12dc51f);
  anon_unknown.dwarf_b919e5::allocateSlice
            (in_stack_fffffffffffffd4c,(MultiFab *)(ulong)in_stack_fffffffffffffd40,
             in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,(Real)in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20);
  rhs = (iterator *)
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffad0);
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,(bool)do_tiling_);
  while (bVar1 = MFIter::isValid((MFIter *)&stack0xfffffffffffffcd0), bVar1) {
    pcVar3 = MFIter::index((MFIter *)&stack0xfffffffffffffcd0,(char *)rhs,__c);
    uVar2 = SUB84(pcVar3,0);
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffad0,
                        (size_type)in_stack_fffffffffffffac8);
    iVar7 = *piVar4;
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffffad0);
    pFVar5 = FabArray<amrex::FArrayBox>::operator[]
                       (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    rhs = (iterator *)
          FabArray<amrex::FArrayBox>::operator[]
                    (in_stack_fffffffffffffad0,(int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
    local_a8 = (pFVar5->super_BaseFab<double>).dptr;
    local_b0 = &(pFVar5->super_BaseFab<double>).domain;
    local_b4 = (pFVar5->super_BaseFab<double>).nvar;
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
    uVar8._0_4_ = (local_b0->smallend).vect[0];
    uVar8._4_4_ = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_c0.z = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
    local_8 = &(pFVar5->super_BaseFab<double>).domain.bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(pFVar5->super_BaseFab<double>).domain.bigend;
    local_1c = 1;
    iStack_34 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_28 = &(pFVar5->super_BaseFab<double>).domain.bigend;
    local_2c = 2;
    local_f0.z = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    this_00 = (Array4<double> *)&stack0xfffffffffffffc70;
    local_e0._0_8_ = local_f0._0_8_;
    local_e0.z = local_f0.z;
    local_c0._0_8_ = uVar8;
    local_a0._0_8_ = uVar8;
    local_a0.z = local_c0.z;
    local_90 = local_b0;
    local_80 = local_c0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    Array4<double>::Array4(this_00,local_a8,&local_c0,&local_e0,local_b4);
    numcomp = (int)uVar8;
    local_198 = (double *)rhs->mi_s;
    local_1a0 = rhs + 1;
    local_1a4 = *(int *)((long)&rhs[2].mi_b + 4);
    local_14c = 0;
    local_178 = *(undefined4 *)&local_1a0->mi_b;
    local_15c = 1;
    uStack_174 = *(undefined4 *)((long)&rhs[1].mi_b + 4);
    local_1c0 = local_1a0->mi_b;
    local_16c = 2;
    local_1b8 = (int)rhs[1].mi_i;
    local_f8 = (int *)((long)&rhs[1].mi_i + 4);
    local_fc = 0;
    local_128 = *local_f8 + 1;
    local_108 = (undefined1 *)((long)&rhs[1].mi_i + 4);
    local_10c = 1;
    iStack_124 = (int)rhs[1].mi_s + 1;
    local_118 = (undefined1 *)((long)&rhs[1].mi_i + 4);
    local_11c = 2;
    local_1cc.z = *(int *)((long)&rhs[1].mi_s + 4) + 1;
    local_1cc.y = iStack_124;
    local_1cc.x = local_128;
    local_1b0 = local_1c0;
    local_1a8 = local_1b8;
    local_190 = local_1c0;
    local_188 = local_1b8;
    local_180 = local_1a0;
    local_170 = local_1b8;
    local_168 = local_1a0;
    local_158 = local_1a0;
    local_148 = local_1a0;
    local_140._0_8_ = local_1cc._0_8_;
    local_140.z = local_1cc.z;
    local_130 = local_1a0;
    local_120 = local_1cc.z;
    Array4<const_double>::Array4
              ((Array4<const_double> *)local_3d8,local_198,(Dim3 *)&local_1b0,&local_1cc,local_1a4);
    destbox = local_3d8;
    MFIter::tilebox((MFIter *)this._M_head_impl);
    local_3e0 = local_3fc;
    if ((in_stack_00000008 & 1) == 0) {
      in_stack_fffffffffffffac8 =
           (MFIter *)CONCAT44((int)((ulong)in_stack_fffffffffffffac8 >> 0x20),in_R9D);
      BaseFab<double>::copy<(amrex::RunOn)0>
                (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                 in_stack_fffffffffffffc74,destbox,in_stack_fffffffffffffc64,numcomp);
    }
    else {
      Gpu::Range<amrex::Box>((Box *)in_stack_fffffffffffffad0);
      local_408 = local_430;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_fffffffffffffad0);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_fffffffffffffad0);
      piVar6 = rhs;
      while( true ) {
        rhs = &local_460;
        bVar1 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=(&local_448,rhs);
        if (!bVar1) break;
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                  ((Box *)&stack0xfffffffffffffb84,&local_448);
        memcpy(&local_4c0,this_00,0x40);
        slice_00.kstride = (Long)this_00;
        slice_00.p = (double *)in_stack_fffffffffffffca0._0_8_;
        slice_00.jstride = in_stack_fffffffffffffca0._8_8_;
        slice_00.nstride = (Long)piVar6;
        slice_00.begin._0_8_ = pFVar5;
        slice_00.begin.z = iVar7;
        slice_00.end.x = uVar2;
        slice_00.end.y = in_stack_fffffffffffffcd0._0_4_;
        slice_00.end.z = in_stack_fffffffffffffcd0._4_4_;
        slice_00.ncomp = in_stack_fffffffffffffcd0._8_4_;
        slice_00._60_4_ = in_stack_fffffffffffffcd0._12_4_;
        in_stack_fffffffffffffac8 = local_4c0;
        in_stack_fffffffffffffad0 = pFStack_4b8;
        amrex_fill_slice_interp
                  (in_stack_fffffffffffffb80,slice_00,in_stack_fffffffffffffb78,
                   in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                   in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffce0);
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_448);
      }
    }
    MFIter::operator++((MFIter *)&stack0xfffffffffffffcd0);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffad0);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x12dcd8a);
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<MultiFab> get_slice_data(int dir, Real coord, const MultiFab& cc, const Geometry& geom, int start_comp, int ncomp, bool interpolate) {

        BL_PROFILE("amrex::get_slice_data");

        if (interpolate) {
            AMREX_ASSERT(cc.nGrow() >= 1);
        }

        const auto geomdata = geom.data();

        Vector<int> slice_to_full_ba_map;
        std::unique_ptr<MultiFab> slice = allocateSlice(dir, cc, ncomp, geom, coord, slice_to_full_ba_map);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*slice, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            int slice_gid = mfi.index();
            int full_gid = slice_to_full_ba_map[slice_gid];
            auto& slice_fab = (*slice)[mfi];
            auto const& full_fab = cc[full_gid];
            Array4<Real> const& slice_arr = slice_fab.array();
            Array4<Real const> const& full_arr = full_fab.const_array();

            const Box& tile_box  = mfi.tilebox();

            if (interpolate)
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA( tile_box, thread_box,
                {
                    amrex_fill_slice_interp(thread_box, slice_arr, full_arr,
                                            0, start_comp, ncomp,
                                            dir, coord, geomdata);
                });
            }
            else
            {
                slice_fab.copy<RunOn::Device>(full_fab, tile_box, start_comp, tile_box, 0, ncomp);
            }
        }

        return slice;
    }